

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O2

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinSCANL_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  ulong uVar1;
  ulong uVar2;
  double e;
  double local_38;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)N;
  if (N < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_C,_ExchCXX::BuiltinPC07OPT_K>_>::
    eval_exc_unpolar(rho[uVar2],sigma[uVar2],lapl[uVar2],tau[uVar2],&local_38);
    eps[uVar2] = local_38 * scal_fact + eps[uVar2];
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}